

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_quad_mesh_builder_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::test::lf_mesh_p_buildTPQuadMesh_Test::TestBody(lf_mesh_p_buildTPQuadMesh_Test *this)

{
  bool bVar1;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  StructuredMeshBuilder *pSVar2;
  Message *pMVar3;
  char *pcVar4;
  element_type *peVar5;
  ostream *poVar6;
  char *in_R9;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  Message local_1a8;
  int local_1a0;
  uint local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180;
  int local_178;
  uint local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  int local_150;
  uint local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_130;
  int local_128;
  uint local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  shared_ptr<lf::mesh::Mesh> mesh_p;
  Matrix<double,_2,_1,_0,_2,_1> local_b8;
  int local_a0 [2];
  Matrix<double,_2,_1,_0,_2,_1> local_98 [2];
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_70;
  undefined1 local_68 [8];
  TPQuadMeshBuilder builder;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_18;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  mesh_factory_ptr;
  lf_mesh_p_buildTPQuadMesh_Test *this_local;
  
  mesh_factory_ptr._M_t.
  super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl =
       (__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
        )(__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
          )this;
  this_00 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            utils::TPQuadMeshBuilder::Logger();
  this_01 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  spdlog::logger::set_level(this_01,trace);
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_18);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
             &local_70,&local_18);
  utils::TPQuadMeshBuilder::TPQuadMeshBuilder((TPQuadMeshBuilder *)local_68,&local_70);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_70);
  local_a0[1] = 0;
  local_a0[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)local_98,local_a0 + 1,local_a0);
  pSVar2 = utils::StructuredMeshBuilder::setBottomLeftCorner<Eigen::Matrix<double,2,1,0,2,1>>
                     ((StructuredMeshBuilder *)local_68,local_98);
  mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_b8,
             (int *)((long)&mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (int *)&mesh_p.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  pSVar2 = utils::StructuredMeshBuilder::setTopRightCorner<Eigen::Matrix<double,2,1,0,2,1>>
                     (pSVar2,&local_b8);
  pSVar2 = utils::StructuredMeshBuilder::setNumXCells(pSVar2,3);
  utils::StructuredMeshBuilder::setNumYCells(pSVar2,2);
  utils::TPQuadMeshBuilder::Build((TPQuadMeshBuilder *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<std::shared_ptr<lf::mesh::Mesh>>
            ((AssertionResult *)local_e0,(shared_ptr<lf::mesh::Mesh> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pMVar3 = testing::Message::operator<<(&local_e8,(char (*) [15])"Oops! no mesh!");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_e0,(AssertionResult *)0x9dde1f,"false"
               ,"true",in_R9);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  local_124 = (**peVar5->_vptr_Mesh)();
  local_128 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_120,"mesh_p->DimMesh()","2",&local_124,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pMVar3 = testing::Message::operator<<(&local_130,(char (*) [22])"Mesh dimension != 2 !");
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  local_14c = (*peVar5->_vptr_Mesh[1])();
  local_150 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_148,"mesh_p->DimWorld()","2",&local_14c,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pMVar3 = testing::Message::operator<<(&local_158,(char (*) [26])"World dimension must be 2");
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x28,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  local_174 = (*peVar5->_vptr_Mesh[3])(peVar5,0);
  local_178 = 6;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_170,"mesh_p->NumEntities(0)","6",&local_174,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pMVar3 = testing::Message::operator<<
                       (&local_180,(char (*) [31])"Mesh should comprise 6 squares");
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x29,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  local_19c = (*peVar5->_vptr_Mesh[3])(peVar5,1);
  local_1a0 = 0x11;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_198,"mesh_p->NumEntities(1)","17",&local_19c,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pMVar3 = testing::Message::operator<<(&local_1a8,(char (*) [30])"Mesh should comprise 17 edges")
    ;
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  local_1c4 = (*peVar5->_vptr_Mesh[3])(peVar5,2);
  local_1c8 = 0xc;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_1c0,"mesh_p->NumEntities(2)","12",&local_1c4,&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pMVar3 = testing::Message::operator<<(&local_1d0,(char (*) [29])"Mesh should have 12 vertices");
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/tp_quad_mesh_builder_tests.cc"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  poVar6 = std::operator<<((ostream *)&std::cout,"Checking entity indexing");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&gtest_ar_.message_);
  test_utils::checkEntityIndexing(peVar5);
  poVar6 = std::operator<<((ostream *)&std::cout,"Checking mesh completeness");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&gtest_ar_.message_);
  test_utils::checkMeshCompleteness(peVar5);
  poVar6 = std::operator<<((ostream *)&std::cout,"Printing mesh information");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  peVar5 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&gtest_ar_.message_);
  utils::PrintInfo((ostream *)&std::cout,peVar5,0xb);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&gtest_ar_.message_);
  utils::TPQuadMeshBuilder::~TPQuadMeshBuilder((TPQuadMeshBuilder *)local_68);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(lf_mesh_p, buildTPQuadMesh) {
  // Enable copious output
  utils::TPQuadMeshBuilder::Logger()->set_level(spdlog::level::trace);
  // Construct a tensor-product grid of the unit square
  // with 6 rectangular cells
  std::unique_ptr<hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<hybrid2d::MeshFactory>(2);
  utils::TPQuadMeshBuilder builder(std::move(mesh_factory_ptr));
  // Set mesh parameters following the Builder pattern
  // Domain is the unit square
  builder.setBottomLeftCorner(Eigen::Vector2d{0, 0})
      .setTopRightCorner(Eigen::Vector2d{1, 1})
      .setNumXCells(3)
      .setNumYCells(2);
  auto mesh_p = builder.Build();

  EXPECT_TRUE(mesh_p) << "Oops! no mesh!";
  EXPECT_EQ(mesh_p->DimMesh(), 2) << "Mesh dimension != 2 !";
  EXPECT_EQ(mesh_p->DimWorld(), 2) << "World dimension must be 2";
  EXPECT_EQ(mesh_p->NumEntities(0), 6) << "Mesh should comprise 6 squares";
  EXPECT_EQ(mesh_p->NumEntities(1), 17) << "Mesh should comprise 17 edges";
  EXPECT_EQ(mesh_p->NumEntities(2), 12) << "Mesh should have 12 vertices";

  std::cout << "Checking entity indexing" << std::endl;
  test_utils::checkEntityIndexing(*mesh_p);
  std::cout << "Checking mesh completeness" << std::endl;
  test_utils::checkMeshCompleteness(*mesh_p);
  std::cout << "Printing mesh information" << std::endl;
  utils::PrintInfo(std::cout, *mesh_p);
}